

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

bool __thiscall glslang::HlslParseContext::hasInput(HlslParseContext *this,TQualifier *qualifier)

{
  bool bVar1;
  TQualifier *qualifier_local;
  HlslParseContext *this_local;
  
  bVar1 = TQualifier::hasAnyLocation(qualifier);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    if (((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) &&
       (((bVar1 = TQualifier::isInterpolation(qualifier), bVar1 ||
         ((*(ulong *)&qualifier->field_0x8 >> 0x1d & 1) != 0)) ||
        ((*(ulong *)&qualifier->field_0x8 >> 0x2d & 1) != 0)))) {
      return true;
    }
    if (((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessEvaluation) &&
       ((*(ulong *)&qualifier->field_0x8 >> 0x2c & 1) != 0)) {
      this_local._7_1_ = true;
    }
    else {
      bVar1 = isInputBuiltIn(this,qualifier);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool HlslParseContext::hasInput(const TQualifier& qualifier) const
{
    if (qualifier.hasAnyLocation())
        return true;

    if (language == EShLangFragment && (qualifier.isInterpolation() || qualifier.centroid || qualifier.sample))
        return true;

    if (language == EShLangTessEvaluation && qualifier.patch)
        return true;

    if (isInputBuiltIn(qualifier))
        return true;

    return false;
}